

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O1

void __thiscall Sampler::Sampler(Sampler *this,int amount,Mat *image)

{
  _Rb_tree_header *p_Var1;
  time_t tVar2;
  ulong uVar3;
  
  this->_Amount = amount;
  cv::Mat::Mat(&this->_Image,image);
  p_Var1 = &(this->_SampleMap_xy)._M_t._M_impl.super__Rb_tree_header;
  (this->_SampleMap_xy)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_SampleMap_xy)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->_SampleMap_xy)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->_SampleMap_xy)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->_SampleMap_xy)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_SampleMap_xy)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_SampleMap_xy)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_SampleMap_xy)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_SampleMap_xy)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  this->_Beamer_Resolution_x = 0x780;
  this->_Beamer_Resolution_y = 0x438;
  uVar3 = *(ulong *)&this->field_0x10 << 0x20 | *(ulong *)&this->field_0x10 >> 0x20;
  this->_X = (int)uVar3;
  this->_Y = (int)(uVar3 >> 0x20);
  return;
}

Assistant:

Sampler(int amount, Mat const& image):
      _Amount(amount),
      _Image(image),
  //    _SampleMap_x(),
      _SampleMap_xy()
      //_Out(generalout),
  //    _Overlapmap(brigthnesmap)
      {
        srand(time(NULL));  //SEED
        _Beamer_Resolution_x = 1920;
        _Beamer_Resolution_y = 1080;
        _X=_Image.cols;
        _Y=_Image.rows;
      }